

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * stbi_load_from_file(FILE *f,int *x,int *y,int *comp,int req_comp)

{
  uchar *puVar1;
  FILE *in_RDI;
  stbi__context s;
  uchar *result;
  FILE *in_stack_fffffffffffffef8;
  stbi__context *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff24;
  int *in_stack_ffffffffffffff28;
  int *in_stack_ffffffffffffff30;
  int *in_stack_ffffffffffffff38;
  stbi__context *in_stack_ffffffffffffff40;
  undefined4 local_48;
  undefined4 local_40;
  
  stbi__start_file(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  puVar1 = stbi__load_flip(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                           in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                           in_stack_ffffffffffffff24);
  if (puVar1 != (uchar *)0x0) {
    fseek(in_RDI,(long)-(local_40 - local_48),1);
  }
  return puVar1;
}

Assistant:

STBIDEF stbi_uc *stbi_load_from_file(FILE *f, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *result;
   stbi__context s;
   stbi__start_file(&s,f);
   result = stbi__load_flip(&s,x,y,comp,req_comp);
   if (result) {
      // need to 'unget' all the characters in the IO buffer
      fseek(f, - (int) (s.img_buffer_end - s.img_buffer), SEEK_CUR);
   }
   return result;
}